

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int session_predicate_altsvc_send(nghttp2_session *session,int32_t stream_id)

{
  int iVar1;
  nghttp2_stream *pnVar2;
  nghttp2_stream *stream;
  int32_t stream_id_local;
  nghttp2_session *session_local;
  
  iVar1 = session_is_closing(session);
  if (iVar1 == 0) {
    if (stream_id == 0) {
      session_local._4_4_ = 0;
    }
    else {
      pnVar2 = nghttp2_session_get_stream(session,stream_id);
      if (pnVar2 == (nghttp2_stream *)0x0) {
        session_local._4_4_ = -0x1fe;
      }
      else if (pnVar2->state == NGHTTP2_STREAM_CLOSING) {
        session_local._4_4_ = -0x1ff;
      }
      else {
        session_local._4_4_ = 0;
      }
    }
  }
  else {
    session_local._4_4_ = -0x212;
  }
  return session_local._4_4_;
}

Assistant:

static int session_predicate_altsvc_send(nghttp2_session *session,
                                         int32_t stream_id) {
  nghttp2_stream *stream;

  if (session_is_closing(session)) {
    return NGHTTP2_ERR_SESSION_CLOSING;
  }

  if (stream_id == 0) {
    return 0;
  }

  stream = nghttp2_session_get_stream(session, stream_id);
  if (stream == NULL) {
    return NGHTTP2_ERR_STREAM_CLOSED;
  }
  if (stream->state == NGHTTP2_STREAM_CLOSING) {
    return NGHTTP2_ERR_STREAM_CLOSING;
  }

  return 0;
}